

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocumentlayout.cpp
# Opt level: O0

QRectF * __thiscall
QTextDocumentLayoutPrivate::layoutFrame
          (QTextDocumentLayoutPrivate *this,QTextFrame *f,int layoutFrom,int layoutTo,
          QFixed frameWidth,QFixed frameHeight,QFixed parentY)

{
  bool bVar1;
  QFixed lhs;
  QFixed lhs_00;
  int extraout_EAX;
  int extraout_EAX_00;
  QFixed lhs_01;
  QFixed lhs_02;
  QFixed QVar2;
  QTextFrameData *pQVar3;
  QTextFrame *pQVar4;
  QTextTable *pQVar5;
  qsizetype qVar6;
  QFixed *pQVar7;
  QFixed *pQVar8;
  __off_t __length;
  long in_RSI;
  char *__file;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  double __x;
  double __x_00;
  double __x_01;
  double __x_02;
  double __x_03;
  double __x_04;
  qreal qVar9;
  int in_stack_00000008;
  QTextFrameData *cd;
  QTextFrame *c;
  int i;
  int currentPage;
  QTextTable *table;
  QTextTableData *td;
  QTextFrameData *pd;
  QTextFrame *parent;
  bool fullLayout;
  QTextFrameData *fd;
  QFixed actualWidth;
  QFixed marginWidth;
  QList<QTextFrame_*> children;
  QFixed maxChildFrameWidth;
  int in_stack_000001d8;
  QFixed in_stack_000001dc;
  QTextLayoutStruct layoutStruct;
  Iterator in_stack_00000330;
  QFixed p;
  QFixed b;
  QFixed bm;
  QFixed tm;
  QFixed newContentsWidth;
  Iterator it;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category_1;
  QTextFrameFormat fformat;
  QLoggingCategoryMacroHolder<(QtMsgType)0> qt_category;
  QFixed in_stack_0000055c;
  QLoggingCategory *in_stack_fffffffffffffb58;
  QFixed *this_00;
  QTextLayoutStruct *in_stack_fffffffffffffb60;
  QRectF *r;
  QPointF *in_stack_fffffffffffffb68;
  QRectF *this_01;
  QRectF *in_stack_fffffffffffffb70;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffffb78;
  undefined4 in_stack_fffffffffffffb90;
  undefined4 in_stack_fffffffffffffb94;
  bool local_461;
  QTextFrameData *local_460;
  uint in_stack_fffffffffffffba8;
  uint in_stack_fffffffffffffbac;
  int local_418;
  bool local_3d1;
  QFixed local_380;
  QFixed local_37c;
  int local_378;
  QFixed local_374;
  QFixed local_370;
  int local_36c;
  int local_368;
  int local_364;
  int local_360;
  int local_35c;
  int local_358;
  QFixed local_354;
  QList<QTextFrame_*> local_350;
  QFixed local_334;
  QFixed local_330;
  int local_32c;
  uint local_328;
  int local_324;
  int local_320;
  uint local_31c;
  QFixed local_318;
  QFixed local_314;
  QFixed local_310;
  QFixed local_30c;
  QFixed local_308;
  QFixed local_304;
  QSizeF local_300;
  int local_2ec;
  int local_2e8;
  int local_2e4;
  int in_stack_fffffffffffffd2c;
  QTextLayoutStruct *in_stack_fffffffffffffd30;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffffd38;
  QDebug local_2c0;
  QSizeF local_2b8;
  QPointF local_2a8;
  qreal local_298;
  qreal local_290;
  qreal local_288;
  qreal local_280;
  int local_274;
  int local_270;
  QFixed local_26c;
  QFixed local_268;
  QFixed local_264;
  int local_260;
  int local_25c;
  int local_258;
  int local_254;
  int local_250;
  int local_24c;
  int local_248;
  int local_244;
  int local_240;
  int local_23c;
  int local_238;
  int local_234;
  undefined1 local_230 [8];
  int local_228;
  int local_224;
  int local_220;
  int local_21c;
  int local_218;
  int local_214;
  int local_210;
  bool local_20c;
  uint local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  qreal local_1e0;
  qreal local_1d8;
  qreal local_1d0;
  qreal local_1c8;
  int in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  QTextTable *in_stack_fffffffffffffe50;
  QTextDocumentLayoutPrivate *in_stack_fffffffffffffe58;
  QFixed local_184;
  QFixed local_180;
  int local_17c;
  int local_178;
  int local_174;
  int local_170;
  int local_16c;
  int local_168;
  int local_164;
  int local_160;
  int local_15c;
  int local_158;
  int local_154;
  int local_150;
  int local_14c;
  int local_148;
  undefined4 local_144;
  int local_140;
  int local_13c;
  undefined4 local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128;
  int local_124;
  int local_120;
  int local_11c;
  int local_118;
  int local_114;
  int local_110;
  int local_10c;
  int local_108;
  int local_104;
  int local_100;
  int local_fc;
  QFixed local_f4;
  int local_f0;
  int local_ec;
  QFixed local_e4;
  int local_e0;
  QFixed local_dc [2];
  QFixed local_d4 [2];
  int local_cc;
  QFixed local_c4;
  int local_c0;
  int local_bc;
  QFixed local_b4;
  int local_b0;
  QFixed local_ac;
  char local_a8 [40];
  int local_80;
  QFixed *local_78;
  QRectF *local_70;
  QRectF *local_68;
  QFixed *local_60;
  QFixed *local_58;
  QRectF *local_50;
  QRectF *local_48;
  QFixed *local_40;
  undefined1 *local_38;
  undefined1 *local_30;
  undefined1 *local_28;
  undefined1 *local_20;
  undefined1 *local_18;
  undefined1 local_10;
  undefined7 uStack_f;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_80 = in_stack_00000008;
  local_18 = &DAT_aaaaaaaaaaaaaaaa;
  local_10 = 0xaa;
  uStack_f = 0xaaaaaaaaaaaaaa;
  QtPrivateLogging::lcLayout();
  anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::QLoggingCategoryMacroHolder
            ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffb60,
             in_stack_fffffffffffffb58);
  while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                           ((QLoggingCategoryMacroHolder *)&local_18), bVar1) {
    anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
              ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x80ac2c);
    QMessageLogger::QMessageLogger
              ((QMessageLogger *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
               (int)((ulong)in_stack_fffffffffffffb60 >> 0x20),(char *)in_stack_fffffffffffffb58,
               (char *)0x80ac45);
    in_stack_fffffffffffffba8 = QTextFrame::firstPosition((QTextFrame *)in_stack_fffffffffffffb58);
    in_stack_fffffffffffffbac = QTextFrame::lastPosition((QTextFrame *)in_stack_fffffffffffffb58);
    pQVar4 = QTextFrame::parentFrame((QTextFrame *)in_stack_fffffffffffffb60);
    QMessageLogger::debug
              (local_a8,"layoutFrame (%d--%d), parent=%p",(ulong)in_stack_fffffffffffffba8,
               (ulong)in_stack_fffffffffffffbac,pQVar4);
    local_10 = 0;
  }
  pQVar3 = ::data((QTextFrame *)in_stack_fffffffffffffb60);
  local_ac.val = -0x55555556;
  QFixed::QFixed(&local_ac);
  local_28 = &DAT_aaaaaaaaaaaaaaaa;
  local_20 = &DAT_aaaaaaaaaaaaaaaa;
  QTextFrame::frameFormat((QTextFrame *)in_stack_fffffffffffffb70);
  local_b0 = 0xaaaaaaaa;
  QTextFrameFormat::topMargin((QTextFrameFormat *)in_stack_fffffffffffffb58);
  scaleToDevice(in_stack_fffffffffffffb78,(qreal)in_stack_fffffffffffffb70);
  local_b4 = QFixed::fromReal((qreal)in_stack_fffffffffffffb58);
  QFixed::round(&local_b4,__x);
  local_bc = (pQVar3->topMargin).val;
  local_b0 = lhs.val;
  local_3d1 = ::operator!=(lhs,(QFixed)local_bc);
  if (local_3d1) {
    (pQVar3->topMargin).val = local_b0;
  }
  local_c0 = 0xaaaaaaaa;
  QTextFrameFormat::bottomMargin((QTextFrameFormat *)in_stack_fffffffffffffb58);
  scaleToDevice(in_stack_fffffffffffffb78,(qreal)in_stack_fffffffffffffb70);
  local_c4 = QFixed::fromReal((qreal)in_stack_fffffffffffffb58);
  QFixed::round(&local_c4,__x_00);
  local_cc = (pQVar3->bottomMargin).val;
  local_c0 = lhs_00.val;
  bVar1 = ::operator!=(lhs_00,(QFixed)local_cc);
  if (bVar1) {
    (pQVar3->bottomMargin).val = local_c0;
    local_3d1 = true;
  }
  QTextFrameFormat::leftMargin((QTextFrameFormat *)in_stack_fffffffffffffb58);
  scaleToDevice(in_stack_fffffffffffffb78,(qreal)in_stack_fffffffffffffb70);
  local_d4[0] = QFixed::fromReal((qreal)in_stack_fffffffffffffb58);
  QFixed::round(local_d4,__x_01);
  (pQVar3->leftMargin).val = extraout_EAX;
  QTextFrameFormat::rightMargin((QTextFrameFormat *)in_stack_fffffffffffffb58);
  scaleToDevice(in_stack_fffffffffffffb78,(qreal)in_stack_fffffffffffffb70);
  local_dc[0] = QFixed::fromReal((qreal)in_stack_fffffffffffffb58);
  QFixed::round(local_dc,__x_02);
  (pQVar3->rightMargin).val = extraout_EAX_00;
  local_e0 = 0xaaaaaaaa;
  QTextFrameFormat::border((QTextFrameFormat *)0x80aee6);
  scaleToDevice(in_stack_fffffffffffffb78,(qreal)in_stack_fffffffffffffb70);
  local_e4 = QFixed::fromReal((qreal)in_stack_fffffffffffffb58);
  QFixed::round(&local_e4,__x_03);
  local_ec = (pQVar3->border).val;
  local_e0 = lhs_01.val;
  bVar1 = ::operator!=(lhs_01,(QFixed)local_ec);
  if (bVar1) {
    (pQVar3->border).val = local_e0;
    local_3d1 = true;
  }
  local_f0 = 0xaaaaaaaa;
  QTextFrameFormat::padding((QTextFrameFormat *)0x80af7d);
  scaleToDevice(in_stack_fffffffffffffb78,(qreal)in_stack_fffffffffffffb70);
  local_f4 = QFixed::fromReal((qreal)in_stack_fffffffffffffb58);
  QFixed::round(&local_f4,__x_04);
  local_fc = (pQVar3->padding).val;
  local_f0 = lhs_02.val;
  bVar1 = ::operator!=(lhs_02,(QFixed)local_fc);
  if (bVar1) {
    (pQVar3->padding).val = local_f0;
    local_3d1 = true;
  }
  pQVar4 = QTextFrame::parentFrame((QTextFrame *)in_stack_fffffffffffffb60);
  if (pQVar4 == (QTextFrame *)0x0) {
    local_460 = (QTextFrameData *)0x0;
  }
  else {
    local_460 = ::data((QTextFrame *)in_stack_fffffffffffffb60);
  }
  if (pQVar4 == (QTextFrame *)0x0) {
    local_150 = (pQVar3->border).val;
    local_14c = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                       (QFixed)(int)in_stack_fffffffffffffb60);
    local_154 = (pQVar3->padding).val;
    local_148 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                       (QFixed)(int)in_stack_fffffffffffffb60);
    (pQVar3->effectiveTopMargin).val = local_148;
    local_160 = (pQVar3->border).val;
    local_15c = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                       (QFixed)(int)in_stack_fffffffffffffb60);
    local_164 = (pQVar3->padding).val;
    local_158 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                       (QFixed)(int)in_stack_fffffffffffffb60);
    (pQVar3->effectiveBottomMargin).val = local_158;
  }
  else {
    local_10c = (pQVar3->topMargin).val;
    local_108 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                       (QFixed)(int)in_stack_fffffffffffffb60);
    local_110 = (pQVar3->border).val;
    local_104 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                       (QFixed)(int)in_stack_fffffffffffffb60);
    local_114 = (pQVar3->padding).val;
    local_100 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                       (QFixed)(int)in_stack_fffffffffffffb60);
    (pQVar3->effectiveTopMargin).val = local_100;
    local_124 = (pQVar3->topMargin).val;
    local_120 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                       (QFixed)(int)in_stack_fffffffffffffb60);
    local_128 = (pQVar3->border).val;
    local_11c = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                       (QFixed)(int)in_stack_fffffffffffffb60);
    local_12c = (pQVar3->padding).val;
    local_118 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                       (QFixed)(int)in_stack_fffffffffffffb60);
    (pQVar3->effectiveBottomMargin).val = local_118;
    pQVar5 = qobject_cast<QTextTable*>((QObject *)0x80b19a);
    if (pQVar5 != (QTextTable *)0x0) {
      local_134 = (local_460->border).val;
      local_130 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                         (QFixed)(int)in_stack_fffffffffffffb60);
      local_138 = *(undefined4 *)
                   ((long)&local_460[1].super_QTextFrameLayoutData._vptr_QTextFrameLayoutData + 4);
      QVar2 = QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,(int)in_stack_fffffffffffffb60);
      QFixed::operator+=(&pQVar3->effectiveTopMargin,QVar2);
      local_140 = (local_460->border).val;
      local_13c = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                         (QFixed)(int)in_stack_fffffffffffffb60);
      local_144 = *(undefined4 *)
                   ((long)&local_460[1].super_QTextFrameLayoutData._vptr_QTextFrameLayoutData + 4);
      QVar2 = QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,(int)in_stack_fffffffffffffb60);
      QFixed::operator+=(&pQVar3->effectiveBottomMargin,QVar2);
    }
  }
  local_174 = (pQVar3->padding).val;
  QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,(QFixed)(int)in_stack_fffffffffffffb60);
  ::operator*(0,(QFixed)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
  local_170 = (int)QFixed::operator-((QFixed *)in_stack_fffffffffffffb58,
                                     (QFixed)(int)in_stack_fffffffffffffb60);
  local_178 = (pQVar3->leftMargin).val;
  local_16c = (int)QFixed::operator-((QFixed *)in_stack_fffffffffffffb58,
                                     (QFixed)(int)in_stack_fffffffffffffb60);
  local_17c = (pQVar3->rightMargin).val;
  local_168 = (int)QFixed::operator-((QFixed *)in_stack_fffffffffffffb58,
                                     (QFixed)(int)in_stack_fffffffffffffb60);
  local_180.val = local_80;
  local_ac = (QFixed)local_168;
  QFixed::QFixed(&local_184,-1);
  bVar1 = ::operator!=(local_180,local_184);
  if (bVar1) {
    QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,(QFixed)(int)in_stack_fffffffffffffb60);
    ::operator*(0,(QFixed)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
    QFixed::operator-((QFixed *)in_stack_fffffffffffffb58,(QFixed)(int)in_stack_fffffffffffffb60);
    QFixed::operator-((QFixed *)in_stack_fffffffffffffb58,(QFixed)(int)in_stack_fffffffffffffb60);
    QVar2 = QFixed::operator-((QFixed *)in_stack_fffffffffffffb58,(int)in_stack_fffffffffffffb60);
    (pQVar3->contentsHeight).val = QVar2.val;
  }
  else {
    (pQVar3->contentsHeight).val = local_80;
  }
  QTextFrameFormat::~QTextFrameFormat((QTextFrameFormat *)0x80b57e);
  bVar1 = isFrameFromInlineObject((QTextFrame *)in_stack_fffffffffffffb60);
  if (bVar1) {
    QRectF::QRectF(in_RDI);
  }
  else {
    pQVar5 = qobject_cast<QTextTable*>((QObject *)0x80b5ad);
    if (pQVar5 == (QTextTable *)0x0) {
      (pQVar3->contentsWidth).val = local_ac.val;
      memcpy(local_230,&DAT_00bd2410,0x90);
      QTextLayoutStruct::QTextLayoutStruct(in_stack_fffffffffffffb60);
      local_23c = (pQVar3->border).val;
      local_238 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                         (QFixed)(int)in_stack_fffffffffffffb60);
      local_240 = (pQVar3->padding).val;
      local_234 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                         (QFixed)(int)in_stack_fffffffffffffb60);
      local_248 = local_ac.val;
      local_228 = local_234;
      local_244 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                         (QFixed)(int)in_stack_fffffffffffffb60);
      local_254 = (pQVar3->border).val;
      local_224 = local_244;
      local_250 = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                         (QFixed)(int)in_stack_fffffffffffffb60);
      local_258 = (pQVar3->padding).val;
      local_24c = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                         (QFixed)(int)in_stack_fffffffffffffb60);
      local_260 = (pQVar3->position).y.val;
      local_21c = local_24c;
      local_25c = (int)QFixed::operator+((QFixed *)in_stack_fffffffffffffb58,
                                         (QFixed)(int)in_stack_fffffffffffffb60);
      local_220 = local_25c;
      QFixed::QFixed(&local_264,0);
      local_218 = local_264.val;
      QFixed::QFixed(&local_268,0);
      local_214 = local_268.val;
      QFixed::QFixed(&local_26c,0x7fffff);
      local_210 = local_26c.val;
      local_461 = true;
      if (local_3d1 == false) {
        local_270 = (pQVar3->oldContentsWidth).val;
        local_274 = local_ac.val;
        local_461 = ::operator!=((QFixed)local_270,local_ac);
      }
      local_20c = local_461;
      QPointF::QPointF(&local_2a8,0.0,0.0);
      QSizeF::QSizeF(&local_2b8,2147483647.0,2147483647.0);
      QRectF::QRectF(in_stack_fffffffffffffb70,in_stack_fffffffffffffb68,
                     (QSizeF *)in_stack_fffffffffffffb60);
      local_1e0 = local_298;
      local_1d8 = local_290;
      local_1d0 = local_288;
      local_1c8 = local_280;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      local_30 = &DAT_aaaaaaaaaaaaaaaa;
      QtPrivateLogging::lcLayout();
      anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::
      QLoggingCategoryMacroHolder
                ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)in_stack_fffffffffffffb60,
                 in_stack_fffffffffffffb58);
      while (bVar1 = (anonymous_namespace)::QLoggingCategoryMacroHolder::operator_cast_to_bool
                               ((QLoggingCategoryMacroHolder *)&local_38), bVar1) {
        anon_unknown.dwarf_13b8fb2::QLoggingCategoryMacroHolder<(QtMsgType)0>::name
                  ((QLoggingCategoryMacroHolder<(QtMsgType)0> *)0x80b935);
        QMessageLogger::QMessageLogger
                  ((QMessageLogger *)in_stack_fffffffffffffb70,(char *)in_stack_fffffffffffffb68,
                   (int)((ulong)in_stack_fffffffffffffb60 >> 0x20),(char *)in_stack_fffffffffffffb58
                   ,(char *)0x80b94e);
        QMessageLogger::debug();
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb78,
                           (char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        local_2e4 = local_228;
        ::operator<<((QDebug *)in_stack_fffffffffffffb60,
                     (QFixed)(int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb78,
                           (char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        local_2e8 = local_224;
        ::operator<<((QDebug *)in_stack_fffffffffffffb60,
                     (QFixed)(int)((ulong)in_stack_fffffffffffffb68 >> 0x20));
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb78,
                           (char *)CONCAT44(in_stack_fffffffffffffbac,in_stack_fffffffffffffba8));
        QDebug::operator<<((QDebug *)in_stack_fffffffffffffb60,
                           SUB81((ulong)in_stack_fffffffffffffb58 >> 0x38,0));
        QDebug::~QDebug(&local_2c0);
        local_30 = (undefined1 *)((ulong)local_30 & 0xffffffffffffff00);
      }
      (pQVar3->oldContentsWidth).val = local_ac.val;
      local_300 = QTextDocument::pageSize((QTextDocument *)in_stack_fffffffffffffb68);
      QVar2.val = (int)in_stack_fffffffffffffb68;
      QSizeF::height(&local_300);
      local_304 = QFixed::fromReal((qreal)in_stack_fffffffffffffb58);
      local_2ec = local_304.val;
      local_1f0 = (uint)local_304;
      QFixed::QFixed(&local_308,0);
      bVar1 = ::operator<(local_304,local_308);
      if (bVar1) {
        QFixed::QFixed(&local_30c,0x7fffff);
        local_1f0 = local_30c.val;
      }
      local_310.val = local_1f0;
      QFixed::QFixed(&local_314,0);
      bVar1 = ::operator==(local_310,local_314);
      if (!bVar1) {
        local_31c = local_1f0;
        __file = (char *)(ulong)local_1f0;
        local_318 = QFixed::operator/((QFixed *)in_stack_fffffffffffffb58,QVar2);
        QFixed::truncate(&local_318,__file,__length);
      }
      local_1e8 = (pQVar3->effectiveTopMargin).val;
      local_1e4 = (pQVar3->effectiveBottomMargin).val;
      local_328 = local_1f0;
      local_324 = (int)::operator*(0,(QFixed)(int)((ulong)in_stack_fffffffffffffb58 >> 0x20));
      local_32c = local_1e4;
      local_320 = (int)QFixed::operator-((QFixed *)in_stack_fffffffffffffb58,
                                         (QFixed)(int)in_stack_fffffffffffffb60);
      local_1ec = local_320;
      pQVar4 = QTextFrame::parentFrame((QTextFrame *)in_stack_fffffffffffffb60);
      if (pQVar4 == (QTextFrame *)0x0) {
        *(undefined8 *)(in_RSI + 0x110) = 0;
      }
      local_58 = (QFixed *)&DAT_aaaaaaaaaaaaaaaa;
      local_50 = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
      local_48 = (QRectF *)&DAT_aaaaaaaaaaaaaaaa;
      local_40 = (QFixed *)&DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::begin((QTextFrame *)CONCAT44(in_stack_fffffffffffffb94,in_stack_fffffffffffffb90))
      ;
      local_78 = local_58;
      local_70 = local_50;
      local_68 = local_48;
      local_60 = local_40;
      QFixed::QFixed(&local_330,0);
      this_00 = local_78;
      r = local_70;
      this_01 = local_68;
      pQVar8 = local_60;
      layoutFlow(in_stack_fffffffffffffd38,in_stack_00000330,in_stack_fffffffffffffd30,
                 in_stack_000001d8,in_stack_fffffffffffffd2c,in_stack_000001dc);
      local_334.val = -0x55555556;
      QFixed::QFixed(&local_334,0);
      local_350.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_350.d.ptr = (QTextFrame **)&DAT_aaaaaaaaaaaaaaaa;
      local_350.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
      QTextFrame::childFrames((QTextFrame *)this_01);
      for (local_418 = 0; qVar6 = QList<QTextFrame_*>::size(&local_350), local_418 < qVar6;
          local_418 = local_418 + 1) {
        QList<QTextFrame_*>::at((QList<QTextFrame_*> *)r,(qsizetype)this_00);
        ::data((QTextFrame *)r);
        pQVar7 = qMax<QFixed>(pQVar8,(QFixed *)this_01);
        local_334.val = pQVar7->val;
      }
      local_354.val = -0x55555556;
      local_360 = (pQVar3->padding).val;
      QFixed::operator+(this_00,(QFixed)(int)r);
      local_35c = (int)::operator*(0,(QFixed)(int)((ulong)this_00 >> 0x20));
      local_364 = (pQVar3->leftMargin).val;
      local_358 = (int)QFixed::operator+(this_00,(QFixed)(int)r);
      local_368 = (pQVar3->rightMargin).val;
      local_354 = QFixed::operator+(this_00,(int)r);
      pQVar4 = QTextFrame::parentFrame((QTextFrame *)r);
      if (pQVar4 == (QTextFrame *)0x0) {
        pQVar7 = qMax<QFixed>(pQVar8,(QFixed *)this_01);
        qVar9 = QFixed::toReal(pQVar7);
        *(qreal *)(in_RSI + 0x110) = qVar9;
        qVar9 = QFixed::toReal(&local_354);
        *(double *)(in_RSI + 0x110) = qVar9 + *(double *)(in_RSI + 0x110);
      }
      local_36c = 0xaaaaaaaa;
      qMax<QFixed>(pQVar8,(QFixed *)this_01);
      pQVar8 = qMax<QFixed>(pQVar8,(QFixed *)this_01);
      local_36c = pQVar8->val;
      (pQVar3->contentsWidth).val = local_36c;
      local_370.val = local_ac.val;
      QFixed::QFixed(&local_374,0);
      bVar1 = operator<=(local_370,local_374);
      if (bVar1) {
        (pQVar3->contentsWidth).val = local_ac.val;
      }
      (pQVar3->minimumWidth).val = local_214;
      (pQVar3->maximumWidth).val = local_210;
      local_37c.val = (pQVar3->contentsHeight).val;
      QFixed::QFixed(&local_380,-1);
      bVar1 = ::operator==(local_37c,local_380);
      if (bVar1) {
        QFixed::operator+(this_00,(QFixed)(int)r);
        QFixed::operator+(this_00,(QFixed)(int)r);
        local_378 = (int)QFixed::operator+(this_00,(QFixed)(int)r);
      }
      else {
        QFixed::operator+(this_00,(QFixed)(int)r);
        ::operator*(0,(QFixed)(int)((ulong)this_00 >> 0x20));
        QFixed::operator+(this_00,(QFixed)(int)r);
        QFixed::operator+(this_00,(QFixed)(int)r);
        local_378 = (int)QFixed::operator+(this_00,(QFixed)(int)r);
      }
      (pQVar3->size).height.val = local_378;
      QVar2 = QFixed::operator+(this_00,(int)r);
      (pQVar3->size).width.val = QVar2.val;
      pQVar3->sizeDirty = false;
      bVar1 = QRectF::isValid((QRectF *)&stack0xfffffffffffffe40);
      if (bVar1) {
        QRectF::operator|=(this_01,r);
      }
      in_RDI->xp = local_1e0;
      in_RDI->yp = local_1d8;
      in_RDI->w = local_1d0;
      in_RDI->h = local_1c8;
      QList<QTextFrame_*>::~QList((QList<QTextFrame_*> *)0x80c206);
      QTextLayoutStruct::~QTextLayoutStruct((QTextLayoutStruct *)0x80c213);
    }
    else {
      (pQVar3->contentsWidth).val = local_ac.val;
      layoutTable(in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c,
                  in_stack_fffffffffffffe48,in_stack_0000055c);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return in_RDI;
}

Assistant:

QRectF QTextDocumentLayoutPrivate::layoutFrame(QTextFrame *f, int layoutFrom, int layoutTo, QFixed frameWidth, QFixed frameHeight, QFixed parentY)
{
    qCDebug(lcLayout, "layoutFrame (%d--%d), parent=%p", f->firstPosition(), f->lastPosition(), f->parentFrame());
    Q_ASSERT(data(f)->sizeDirty);

    QTextFrameData *fd = data(f);
    QFixed newContentsWidth;

    bool fullLayout = false;
    {
        QTextFrameFormat fformat = f->frameFormat();
        // set sizes of this frame from the format
        QFixed tm = QFixed::fromReal(scaleToDevice(fformat.topMargin())).round();
        if (tm != fd->topMargin) {
            fd->topMargin = tm;
            fullLayout = true;
        }
        QFixed bm = QFixed::fromReal(scaleToDevice(fformat.bottomMargin())).round();
        if (bm != fd->bottomMargin) {
            fd->bottomMargin = bm;
            fullLayout = true;
        }
        fd->leftMargin = QFixed::fromReal(scaleToDevice(fformat.leftMargin())).round();
        fd->rightMargin = QFixed::fromReal(scaleToDevice(fformat.rightMargin())).round();
        QFixed b = QFixed::fromReal(scaleToDevice(fformat.border())).round();
        if (b != fd->border) {
            fd->border = b;
            fullLayout = true;
        }
        QFixed p = QFixed::fromReal(scaleToDevice(fformat.padding())).round();
        if (p != fd->padding) {
            fd->padding = p;
            fullLayout = true;
        }

        QTextFrame *parent = f->parentFrame();
        const QTextFrameData *pd = parent ? data(parent) : nullptr;

        // accumulate top and bottom margins
        if (parent) {
            fd->effectiveTopMargin = pd->effectiveTopMargin + fd->topMargin + fd->border + fd->padding;
            fd->effectiveBottomMargin = pd->effectiveBottomMargin + fd->topMargin + fd->border + fd->padding;

            if (qobject_cast<QTextTable *>(parent)) {
                const QTextTableData *td = static_cast<const QTextTableData *>(pd);
                fd->effectiveTopMargin += td->cellSpacing + td->border + td->cellPadding;
                fd->effectiveBottomMargin += td->cellSpacing + td->border + td->cellPadding;
            }
        } else {
            fd->effectiveTopMargin = fd->topMargin + fd->border + fd->padding;
            fd->effectiveBottomMargin = fd->bottomMargin + fd->border + fd->padding;
        }

        newContentsWidth = frameWidth - 2*(fd->border + fd->padding)
                           - fd->leftMargin - fd->rightMargin;

        if (frameHeight != -1) {
            fd->contentsHeight = frameHeight - 2*(fd->border + fd->padding)
                                 - fd->topMargin - fd->bottomMargin;
        } else {
            fd->contentsHeight = frameHeight;
        }
    }

    if (isFrameFromInlineObject(f)) {
        // never reached, handled in resizeInlineObject/positionFloat instead
        return QRectF();
    }

    if (QTextTable *table = qobject_cast<QTextTable *>(f)) {
        fd->contentsWidth = newContentsWidth;
        return layoutTable(table, layoutFrom, layoutTo, parentY);
    }

    // set fd->contentsWidth temporarily, so that layoutFrame for the children
    // picks the right width. We'll initialize it properly at the end of this
    // function.
    fd->contentsWidth = newContentsWidth;

    QTextLayoutStruct layoutStruct;
    layoutStruct.frame = f;
    layoutStruct.x_left = fd->leftMargin + fd->border + fd->padding;
    layoutStruct.x_right = layoutStruct.x_left + newContentsWidth;
    layoutStruct.y = fd->topMargin + fd->border + fd->padding;
    layoutStruct.frameY = parentY + fd->position.y;
    layoutStruct.contentsWidth = 0;
    layoutStruct.minimumWidth = 0;
    layoutStruct.maximumWidth = QFIXED_MAX;
    layoutStruct.fullLayout = fullLayout || (fd->oldContentsWidth != newContentsWidth);
    layoutStruct.updateRect = QRectF(QPointF(0, 0), QSizeF(qreal(INT_MAX), qreal(INT_MAX)));
    qCDebug(lcLayout) << "layoutStruct: x_left" << layoutStruct.x_left << "x_right" << layoutStruct.x_right
                      << "fullLayout" << layoutStruct.fullLayout;
    fd->oldContentsWidth = newContentsWidth;

    layoutStruct.pageHeight = QFixed::fromReal(document->pageSize().height());
    if (layoutStruct.pageHeight < 0)
        layoutStruct.pageHeight = QFIXED_MAX;

    const int currentPage = layoutStruct.pageHeight == 0 ? 0 : (layoutStruct.frameY / layoutStruct.pageHeight).truncate();
    layoutStruct.pageTopMargin = fd->effectiveTopMargin;
    layoutStruct.pageBottomMargin = fd->effectiveBottomMargin;
    layoutStruct.pageBottom = (currentPage + 1) * layoutStruct.pageHeight - layoutStruct.pageBottomMargin;

    if (!f->parentFrame())
        idealWidth = 0; // reset

    QTextFrame::Iterator it = f->begin();
    layoutFlow(it, &layoutStruct, layoutFrom, layoutTo);

    QFixed maxChildFrameWidth = 0;
    QList<QTextFrame *> children = f->childFrames();
    for (int i = 0; i < children.size(); ++i) {
        QTextFrame *c = children.at(i);
        QTextFrameData *cd = data(c);
        maxChildFrameWidth = qMax(maxChildFrameWidth, cd->size.width);
    }

    const QFixed marginWidth = 2*(fd->border + fd->padding) + fd->leftMargin + fd->rightMargin;
    if (!f->parentFrame()) {
        idealWidth = qMax(maxChildFrameWidth, layoutStruct.contentsWidth).toReal();
        idealWidth += marginWidth.toReal();
    }

    QFixed actualWidth = qMax(newContentsWidth, qMax(maxChildFrameWidth, layoutStruct.contentsWidth));
    fd->contentsWidth = actualWidth;
    if (newContentsWidth <= 0) { // nowrap layout?
        fd->contentsWidth = newContentsWidth;
    }

    fd->minimumWidth = layoutStruct.minimumWidth;
    fd->maximumWidth = layoutStruct.maximumWidth;

    fd->size.height = fd->contentsHeight == -1
                 ? layoutStruct.y + fd->border + fd->padding + fd->bottomMargin
                 : fd->contentsHeight + 2*(fd->border + fd->padding) + fd->topMargin + fd->bottomMargin;
    fd->size.width = actualWidth + marginWidth;
    fd->sizeDirty = false;
    if (layoutStruct.updateRectForFloats.isValid())
        layoutStruct.updateRect |= layoutStruct.updateRectForFloats;
    return layoutStruct.updateRect;
}